

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverAlternatingMaximization.h
# Opt level: O0

double __thiscall
BGIP_SolverAlternatingMaximization<JointPolicyPureVector>::ComputeBestResponse
          (BGIP_SolverAlternatingMaximization<JointPolicyPureVector> *this,
          JointPolicyPureVector *jpolBG,Index optimizingAgentI)

{
  undefined4 uVar1;
  ulong uVar2;
  ulong uVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  size_t sVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  undefined4 in_EDX;
  long *in_RSI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double v_t_a;
  Index acI_1;
  Index best_a;
  double v_t;
  Index type_1;
  double v_best;
  double u;
  Index jaInew;
  Index acI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> avec;
  Index jaI;
  double jtProb;
  Index type;
  vector<unsigned_int,_std::allocator<unsigned_int>_> types;
  Index jt;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  v;
  Index agI;
  BayesianGameIdenticalPayoffInterface *bgipRawPtr;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> bgip;
  undefined4 in_stack_fffffffffffffe38;
  Index in_stack_fffffffffffffe3c;
  BayesianGameBase *in_stack_fffffffffffffe40;
  allocator_type *in_stack_fffffffffffffe48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe88;
  BayesianGameBase *in_stack_fffffffffffffe90;
  BayesianGameBase *in_stack_fffffffffffffe98;
  uint local_100;
  uint local_fc;
  double local_f8;
  uint local_ec;
  double local_e8;
  uint local_d4;
  undefined1 local_d0 [28];
  undefined4 local_b4;
  ulong local_b0;
  value_type local_a4;
  uint local_88;
  undefined8 local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_50;
  undefined4 local_34;
  element_type *local_30;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_28;
  undefined4 local_14;
  long *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  BayesianGameIdenticalPayoffSolver::GetBGIPI
            ((BayesianGameIdenticalPayoffSolver *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_30 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::get(&local_28);
  local_34 = local_14;
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_28);
  BayesianGameBase::GetNrTypes(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  (**(code **)(*(long *)local_30 + 0x20))(local_30,local_34);
  local_80 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x12bd97);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (value_type_conflict2 *)in_stack_fffffffffffffe50,
             (allocator_type *)in_stack_fffffffffffffe48);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x12bdd3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
           in_stack_fffffffffffffe48);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x12be07);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe50);
  std::allocator<double>::~allocator((allocator<double> *)0x12be21);
  local_88 = 0;
  while( true ) {
    uVar2 = (ulong)local_88;
    uVar3 = BayesianGameBase::GetNrJointTypes();
    if (uVar3 <= uVar2) break;
    BayesianGameBase::JointToIndividualTypeIndices
              (in_stack_fffffffffffffe98,(Index)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffe40,
                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    local_a4 = *pvVar4;
    local_b0 = (**(code **)(*(long *)local_30 + 0x68))(local_30,local_88);
    local_b4 = (**(code **)(*local_10 + 0x88))(local_10,local_88);
    BayesianGameBase::JointToIndividualActionIndices
              ((BayesianGameBase *)in_stack_fffffffffffffe48,
               (Index)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    local_d4 = 0;
    while( true ) {
      in_stack_fffffffffffffe90 = (BayesianGameBase *)(ulong)local_d4;
      in_stack_fffffffffffffe98 =
           (BayesianGameBase *)(**(code **)(*(long *)local_30 + 0x20))(local_30,local_34);
      if (in_stack_fffffffffffffe98 <= in_stack_fffffffffffffe90) break;
      in_stack_fffffffffffffe88 =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffe40,
                      CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      *(uint *)&(in_stack_fffffffffffffe88->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = local_d4;
      uVar1 = (**(code **)(*(long *)local_30 + 0x38))(local_30,local_d0);
      auVar9._0_8_ = (**(code **)(*(long *)local_30 + 0x80))(local_30,local_88,uVar1);
      uVar2 = local_b0;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_50,(ulong)local_a4);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_d4);
      auVar9._8_8_ = 0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar2;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *pvVar6;
      auVar9 = vfmadd213sd_fma(auVar9,auVar10,auVar11);
      *pvVar6 = auVar9._0_8_;
      local_d4 = local_d4 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe50);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe50);
    local_88 = local_88 + 1;
  }
  local_e8 = 0.0;
  local_ec = 0;
  while( true ) {
    uVar2 = (ulong)local_ec;
    sVar7 = BayesianGameBase::GetNrTypes(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    if (sVar7 <= uVar2) break;
    local_f8 = -1.79769313486232e+308;
    local_fc = 0;
    local_100 = 0;
    while( true ) {
      pvVar8 = (vector<double,_std::allocator<double>_> *)(ulong)local_100;
      in_stack_fffffffffffffe50 =
           (vector<double,_std::allocator<double>_> *)
           (**(code **)(*(long *)local_30 + 0x20))(local_30,local_34);
      if (in_stack_fffffffffffffe50 <= pvVar8) break;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_50,(ulong)local_ec);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_100);
      if (local_f8 < *pvVar6) {
        local_fc = local_100;
        local_f8 = *pvVar6;
      }
      local_100 = local_100 + 1;
    }
    local_e8 = local_e8 + local_f8;
    (**(code **)(*local_10 + 0x80))(local_10,local_34,local_ec,local_fc);
    local_ec = local_ec + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffe50);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x12c35c);
  return local_e8;
}

Assistant:

double ComputeBestResponse(JP & jpolBG, 
            Index optimizingAgentI)
        {
            if(DEBUG_CBR)
            {
                std::cout << "ComputeBestResponse called - current jpolBG:"<<std::endl;
                jpolBG.Print();
                std::cout << "value="<<this->Evaluate(jpolBG)<<std::endl;
            }
            boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> bgip=
                this->GetBGIPI();
            const BayesianGameIdenticalPayoffInterface* bgipRawPtr=bgip.get();
            Index agI = optimizingAgentI;
            std::vector< std::vector<double> > v (bgip->GetNrTypes(agI), std::vector<double>(
                                            bgipRawPtr->GetNrActions(agI), 0.0) );
    
            if(DEBUG_CBR)
                std::cout << "ComputeBestResponse: compute all type-action values for agent agI..."<<std::endl;
            //compute all type-action values for agent agI
            for(Index jt = 0; jt < bgipRawPtr->GetNrJointTypes(); jt++)
            {
                std::vector<Index> types = bgipRawPtr->JointToIndividualTypeIndices(jt);
                Index type = types.at(agI);
                double jtProb = bgipRawPtr->GetProbability(jt);
                Index jaI = jpolBG.GetJointActionIndex(jt);
                std::vector<Index> avec = bgipRawPtr->JointToIndividualActionIndices(jaI);
                for(Index acI =0 ; acI < bgipRawPtr->GetNrActions(agI); acI++)
                {
                    avec.at(agI) = acI;
                    Index jaInew = bgipRawPtr->IndividualToJointActionIndices(avec);
                    double u =  bgipRawPtr->GetUtility(jt, jaInew);
                    v[type][acI] +=  jtProb * u;
                    if(DEBUG_CBR)
                        std::cout << "updated v[type][acI]="<<v[type][acI]<< 
                            "(jtProb=" << jtProb << ", u=" << u <<")" <<std::endl;
                }
            }
            if(DEBUG_CBR)
                std::cout << "ComputeBestResponse: compute the best response and value..."<<std::endl;
            //compute the best response and value
            double v_best = 0.0;
            for(Index type = 0; type < bgipRawPtr->GetNrTypes(agI); type++)
            {
                double v_t = -DBL_MAX;
                Index best_a = 0;
                for(Index acI = 0; acI < bgipRawPtr->GetNrActions(agI); acI++)
                {
                    double v_t_a = v[type][acI];
                    if(v_t_a > v_t)
                    {
                        best_a = acI;
                        v_t = v_t_a;
                    }
                }
                v_best += v_t;
                jpolBG.SetAction(agI, type, best_a);
            }
            return v_best;
        }